

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZProjectEllipse.cpp
# Opt level: O0

void __thiscall
TPZProjectEllipse::PrintAxes(TPZProjectEllipse *this,TPZFMatrix<double> *P,ostream *out)

{
  long lVar1;
  int64_t iVar2;
  ostream *poVar3;
  ostream *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<double> *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  std::operator<<(in_RDX,"\nPrinting axes of the ellipse:\n");
  AlmostZeroToZero((TPZProjectEllipse *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  iVar5 = 0;
  while( true ) {
    lVar1 = (long)iVar5;
    iVar2 = TPZBaseMatrix::Cols(in_RSI);
    if (iVar2 <= lVar1) break;
    poVar3 = std::operator<<(in_RDX,"Vector");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5 + 1);
    std::operator<<(poVar3," = ( ");
    iVar4 = 0;
    while( true ) {
      lVar1 = (long)iVar4;
      iVar2 = TPZBaseMatrix::Rows(in_RSI);
      if (iVar2 <= lVar1) break;
      if (iVar4 != 0) {
        std::operator<<(in_RDX," , ");
      }
      (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RSI,(long)iVar4,(long)iVar5);
      std::ostream::operator<<(in_RDX,extraout_XMM0_Qa);
      iVar4 = iVar4 + 1;
    }
    std::operator<<(in_RDX," )\n");
    iVar5 = iVar5 + 1;
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZProjectEllipse::PrintAxes(TPZFMatrix<REAL> &P,std::ostream &out) {
	out << "\nPrinting axes of the ellipse:\n";
	AlmostZeroToZero(P);
	for(int i=0;i<P.Cols();i++) {
		out << "Vector" << i+1 << " = ( ";
		for(int j=0;j<P.Rows();j++) {
			if(j) out << " , ";
			out << P.GetVal(j,i);
		}
		out << " )\n";
	}
	out << std::endl;
}